

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O3

pnode_t * append_word(s3wid_t w,pnode_t *prev_end,s3cipid_t *pred_ci,s3cipid_t *succ_ci)

{
  pnode_s **pppVar1;
  short sVar2;
  int iVar3;
  s3cipid_t *psVar4;
  short *psVar5;
  pnode_t *dst;
  pnode_t *dst_00;
  ulong uVar6;
  pnode_t *ppVar7;
  uint pos;
  ulong uVar8;
  pnode_s *ppVar9;
  int iVar10;
  int iVar11;
  
  iVar10 = -1;
  psVar5 = pred_ci;
  do {
    iVar10 = iVar10 + 1;
    sVar2 = *psVar5;
    psVar5 = psVar5 + 1;
  } while (-1 < sVar2);
  iVar11 = -1;
  psVar5 = succ_ci;
  do {
    iVar11 = iVar11 + 1;
    sVar2 = *psVar5;
    psVar5 = psVar5 + 1;
  } while (-1 < sVar2);
  iVar3 = dict->word[(uint)w].pronlen;
  if (iVar3 == 1) {
    uVar8 = 0;
    dst = (pnode_t *)0x0;
    do {
      uVar6 = 0;
      ppVar7 = dst;
      do {
        dst = alloc_pnode(w,0,*dict->word[(uint)w].ciphone,pred_ci[uVar8],succ_ci[uVar6],
                          WORD_POSN_SINGLE);
        ppVar9 = prev_end;
        if (prev_end != (pnode_t *)0x0) {
          do {
            if ((ppVar9->ci == dst->lc) && ((ppVar9->rc < 0 || (ppVar9->rc == dst->ci)))) {
              link_pnodes(ppVar9,dst);
            }
            pppVar1 = &ppVar9->next;
            ppVar9 = *pppVar1;
          } while (*pppVar1 != (pnode_s *)0x0);
        }
        dst->next = ppVar7;
        uVar6 = uVar6 + 1;
        ppVar7 = dst;
      } while (uVar6 != iVar11 + (uint)(iVar11 == 0));
      uVar8 = uVar8 + 1;
    } while (uVar8 != iVar10 + (uint)(iVar10 == 0));
  }
  else {
    uVar8 = 0;
    ppVar7 = (pnode_t *)0x0;
    do {
      psVar4 = dict->word[(uint)w].ciphone;
      dst_00 = alloc_pnode(w,0,*psVar4,pred_ci[uVar8],psVar4[1],WORD_POSN_BEGIN);
      ppVar9 = prev_end;
      if (prev_end != (pnode_t *)0x0) {
        do {
          if ((ppVar9->ci == dst_00->lc) && ((ppVar9->rc < 0 || (ppVar9->rc == dst_00->ci)))) {
            link_pnodes(ppVar9,dst_00);
          }
          pppVar1 = &ppVar9->next;
          ppVar9 = *pppVar1;
        } while (*pppVar1 != (pnode_s *)0x0);
      }
      dst_00->next = ppVar7;
      uVar8 = uVar8 + 1;
      ppVar7 = dst_00;
    } while (uVar8 != iVar10 + (uint)(iVar10 == 0));
    if (iVar3 < 3) {
      pos = 1;
    }
    else {
      pos = iVar3 - 1;
      uVar8 = 1;
      ppVar9 = dst_00;
      do {
        psVar4 = dict->word[(uint)w].ciphone;
        dst_00 = alloc_pnode(w,(int32)uVar8,psVar4[uVar8],psVar4[uVar8 - 1],psVar4[uVar8 + 1],
                             WORD_POSN_INTERNAL);
        for (; ppVar9 != (pnode_t *)0x0; ppVar9 = ppVar9->next) {
          link_pnodes(ppVar9,dst_00);
        }
        uVar8 = uVar8 + 1;
        ppVar9 = dst_00;
      } while (uVar8 != pos);
    }
    uVar8 = 0;
    ppVar7 = (pnode_t *)0x0;
    do {
      psVar4 = dict->word[(uint)w].ciphone;
      dst = alloc_pnode(w,pos,psVar4[pos],psVar4[(ulong)pos - 1],succ_ci[uVar8],WORD_POSN_END);
      for (ppVar9 = dst_00; ppVar9 != (pnode_t *)0x0; ppVar9 = ppVar9->next) {
        link_pnodes(ppVar9,dst);
      }
      dst->next = ppVar7;
      uVar8 = uVar8 + 1;
      ppVar7 = dst;
    } while (uVar8 != iVar11 + (uint)(iVar11 == 0));
  }
  return dst;
}

Assistant:

static pnode_t *
append_word(s3wid_t w,
            pnode_t * prev_end, s3cipid_t * pred_ci, s3cipid_t * succ_ci)
{
    int32 i, M, N, m, n, pronlen, pron;
    pnode_t *node, *nodelist, *p;

    for (i = 0; IS_S3CIPID(pred_ci[i]); i++);
    M = (i > 0) ? i : 1;        /* #predecessor CI phones */

    for (i = 0; IS_S3CIPID(succ_ci[i]); i++);
    N = (i > 0) ? i : 1;        /* #successor CI phones */

    if ((pronlen = dict->word[w].pronlen) == 1) {
        /* Single phone case; replicated MxN times for all possible contexts */
        nodelist = NULL;

        for (m = 0; m < M; m++) {
            for (n = 0; n < N; n++) {
                node = alloc_pnode(w, 0,
                                   dict->word[w].ciphone[0], pred_ci[m],
                                   succ_ci[n], WORD_POSN_SINGLE);
                /* Link to all predecessor nodes matching context requirements */
                for (p = prev_end; p; p = p->next) {
                    if ((p->ci == node->lc) &&
                        ((NOT_S3CIPID(p->rc)) || (p->rc == node->ci))) {
                        link_pnodes(p, node);
                    }
                }

                node->next = nodelist;
                nodelist = node;
            }
        }

        return nodelist;
    }

    /* Multi-phone case.  First phone, replicated M times */
    nodelist = NULL;
    for (m = 0; m < M; m++) {
        node = alloc_pnode(w, 0,
                           dict->word[w].ciphone[0],
                           pred_ci[m],
                           dict->word[w].ciphone[1], WORD_POSN_BEGIN);
        /* Link to predecessor node(s) matching context requirements */
        for (p = prev_end; p; p = p->next) {
            if ((p->ci == node->lc) &&
                ((NOT_S3CIPID(p->rc)) || (p->rc == node->ci))) {
                link_pnodes(p, node);
            }
        }
        node->next = nodelist;
        nodelist = node;
    }

    /* Intermediate phones */
    for (pron = 1; pron < pronlen - 1; pron++) {
        node = alloc_pnode(w, pron,
                           dict->word[w].ciphone[pron],
                           dict->word[w].ciphone[pron - 1],
                           dict->word[w].ciphone[pron + 1],
                           WORD_POSN_INTERNAL);
        for (p = nodelist; p; p = p->next)
            link_pnodes(p, node);
        nodelist = node;
    }

    /* Final phone, replicated N times */
    prev_end = nodelist;
    nodelist = NULL;
    for (n = 0; n < N; n++) {
        node = alloc_pnode(w, pron,
                           dict->word[w].ciphone[pron],
                           dict->word[w].ciphone[pron - 1],
                           succ_ci[n], WORD_POSN_END);
        for (p = prev_end; p; p = p->next)
            link_pnodes(p, node);
        node->next = nodelist;
        nodelist = node;
    }

    return nodelist;
}